

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_int.hpp
# Opt level: O1

ans_int_decode * ans_int_decode::load(ans_int_decode *__return_storage_ptr__,uint8_t *in_u8)

{
  long lVar1;
  uint uVar2;
  uint *puVar3;
  uint *puVar4;
  pointer puVar5;
  pointer puVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 uVar10;
  byte bVar11;
  byte bVar12;
  uint64_t uVar13;
  uint *puVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  uint *puVar18;
  uint *puVar19;
  ulong uVar20;
  long lVar21;
  ushort uVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 extraout_var [56];
  undefined1 auVar29 [64];
  undefined1 in_XMM6 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->table).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->table).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->table).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ans_load_interp(&local_38,in_u8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&__return_storage_ptr__->nfreqs,&local_38);
  if (local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  puVar3 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar14 = puVar3 + 1;
  puVar18 = puVar3;
  puVar19 = puVar3;
  if (puVar14 != puVar4 && puVar3 != puVar4) {
    do {
      puVar18 = puVar14;
      if (*puVar14 <= *puVar19) {
        puVar18 = puVar19;
      }
      puVar14 = puVar14 + 1;
      puVar19 = puVar18;
    } while (puVar14 != puVar4);
  }
  uVar2 = *puVar18;
  if (puVar3 == puVar4) {
    uVar13 = 0;
  }
  else {
    auVar24 = vpbroadcastq_avx512f();
    auVar24 = vpsrlq_avx512f(auVar24,2);
    auVar29 = ZEXT1664((undefined1  [16])0x0);
    uVar15 = 0;
    auVar25 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar26 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar27 = vmovdqa64_avx512f(auVar29);
      auVar29 = vpbroadcastq_avx512f();
      auVar28 = vporq_avx512f(auVar29,auVar25);
      auVar29 = vporq_avx512f(auVar29,auVar26);
      uVar10 = vpcmpuq_avx512f(auVar29,auVar24,2);
      bVar11 = (byte)uVar10;
      uVar10 = vpcmpuq_avx512f(auVar28,auVar24,2);
      bVar12 = (byte)uVar10;
      uVar22 = CONCAT11(bVar12,bVar11);
      auVar29 = vmovdqu32_avx512f(*(undefined1 (*) [64])(puVar3 + uVar15));
      auVar28._4_4_ = (uint)((byte)(uVar22 >> 1) & 1) * auVar29._4_4_;
      auVar28._0_4_ = (uint)(bVar11 & 1) * auVar29._0_4_;
      auVar28._8_4_ = (uint)((byte)(uVar22 >> 2) & 1) * auVar29._8_4_;
      auVar28._12_4_ = (uint)((byte)(uVar22 >> 3) & 1) * auVar29._12_4_;
      auVar28._16_4_ = (uint)((byte)(uVar22 >> 4) & 1) * auVar29._16_4_;
      auVar28._20_4_ = (uint)((byte)(uVar22 >> 5) & 1) * auVar29._20_4_;
      auVar28._24_4_ = (uint)((byte)(uVar22 >> 6) & 1) * auVar29._24_4_;
      auVar28._28_4_ = (uint)((byte)(uVar22 >> 7) & 1) * auVar29._28_4_;
      auVar28._32_4_ = (uint)(bVar12 & 1) * auVar29._32_4_;
      auVar28._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar29._36_4_;
      auVar28._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar29._40_4_;
      auVar28._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar29._44_4_;
      auVar28._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar29._48_4_;
      auVar28._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar29._52_4_;
      auVar28._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar29._56_4_;
      auVar28._60_4_ = (uint)(bVar12 >> 7) * auVar29._60_4_;
      auVar29 = vpaddd_avx512f(auVar28,auVar27);
      uVar15 = uVar15 + 0x10;
    } while ((((ulong)((long)puVar4 + (-4 - (long)puVar3)) >> 2) + 0x10 & 0xfffffffffffffff0) !=
             uVar15);
    auVar24 = vmovdqa32_avx512f(auVar29);
    auVar25._0_4_ = (uint)(bVar11 & 1) * auVar24._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar27._0_4_;
    bVar7 = (bool)((byte)(uVar22 >> 1) & 1);
    auVar25._4_4_ = (uint)bVar7 * auVar24._4_4_ | (uint)!bVar7 * auVar27._4_4_;
    bVar7 = (bool)((byte)(uVar22 >> 2) & 1);
    auVar25._8_4_ = (uint)bVar7 * auVar24._8_4_ | (uint)!bVar7 * auVar27._8_4_;
    bVar7 = (bool)((byte)(uVar22 >> 3) & 1);
    auVar25._12_4_ = (uint)bVar7 * auVar24._12_4_ | (uint)!bVar7 * auVar27._12_4_;
    bVar7 = (bool)((byte)(uVar22 >> 4) & 1);
    auVar25._16_4_ = (uint)bVar7 * auVar24._16_4_ | (uint)!bVar7 * auVar27._16_4_;
    bVar7 = (bool)((byte)(uVar22 >> 5) & 1);
    auVar25._20_4_ = (uint)bVar7 * auVar24._20_4_ | (uint)!bVar7 * auVar27._20_4_;
    bVar7 = (bool)((byte)(uVar22 >> 6) & 1);
    auVar25._24_4_ = (uint)bVar7 * auVar24._24_4_ | (uint)!bVar7 * auVar27._24_4_;
    bVar7 = (bool)((byte)(uVar22 >> 7) & 1);
    auVar25._28_4_ = (uint)bVar7 * auVar24._28_4_ | (uint)!bVar7 * auVar27._28_4_;
    auVar25._32_4_ =
         (uint)(bVar12 & 1) * auVar24._32_4_ | (uint)!(bool)(bVar12 & 1) * auVar27._32_4_;
    bVar7 = (bool)(bVar12 >> 1 & 1);
    auVar25._36_4_ = (uint)bVar7 * auVar24._36_4_ | (uint)!bVar7 * auVar27._36_4_;
    bVar7 = (bool)(bVar12 >> 2 & 1);
    auVar25._40_4_ = (uint)bVar7 * auVar24._40_4_ | (uint)!bVar7 * auVar27._40_4_;
    bVar7 = (bool)(bVar12 >> 3 & 1);
    auVar25._44_4_ = (uint)bVar7 * auVar24._44_4_ | (uint)!bVar7 * auVar27._44_4_;
    bVar7 = (bool)(bVar12 >> 4 & 1);
    auVar25._48_4_ = (uint)bVar7 * auVar24._48_4_ | (uint)!bVar7 * auVar27._48_4_;
    bVar7 = (bool)(bVar12 >> 5 & 1);
    auVar25._52_4_ = (uint)bVar7 * auVar24._52_4_ | (uint)!bVar7 * auVar27._52_4_;
    bVar7 = (bool)(bVar12 >> 6 & 1);
    auVar25._56_4_ = (uint)bVar7 * auVar24._56_4_ | (uint)!bVar7 * auVar27._56_4_;
    auVar25._60_4_ =
         (uint)(bVar12 >> 7) * auVar24._60_4_ | (uint)!(bool)(bVar12 >> 7) * auVar27._60_4_;
    auVar23 = vextracti64x4_avx512f(auVar25,1);
    auVar24 = vpaddd_avx512f(auVar25,ZEXT3264(auVar23));
    auVar8 = vpaddd_avx(auVar24._0_16_,auVar24._16_16_);
    auVar9 = vpshufd_avx(auVar8,0xee);
    auVar8 = vpaddd_avx(auVar8,auVar9);
    auVar9 = vpshufd_avx(auVar8,0x55);
    auVar8 = vpaddd_avx(auVar8,auVar9);
    uVar13 = (uint64_t)auVar8._0_4_;
  }
  __return_storage_ptr__->frame_size = uVar13;
  __return_storage_ptr__->frame_mask = uVar13 - 1;
  auVar8 = vcvtusi2sd_avx512f(in_XMM6,uVar13);
  auVar24._0_8_ = log2(auVar8._0_8_);
  auVar24._8_56_ = extraout_var;
  uVar13 = vcvttsd2usi_avx512f(auVar24._0_16_);
  __return_storage_ptr__->frame_log2 = uVar13;
  lVar21 = (long)(__return_storage_ptr__->nfreqs).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(__return_storage_ptr__->nfreqs).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start >> 2;
  if (uVar2 < 0x10000) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&__return_storage_ptr__->table,__return_storage_ptr__->frame_size << 3);
    __return_storage_ptr__->table_type = SMALL;
    puVar5 = (__return_storage_ptr__->nfreqs).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar6 = (__return_storage_ptr__->table).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar15 = 0;
    lVar16 = 0;
    do {
      uVar2 = puVar5[lVar16];
      if ((ulong)uVar2 != 0) {
        lVar1 = uVar15 * 8;
        uVar20 = 0;
        do {
          *(short *)(puVar6 + uVar20 * 8 + lVar1) = (short)uVar2;
          *(int *)(puVar6 + uVar20 * 8 + lVar1 + 4) = (int)lVar16;
          *(short *)(puVar6 + uVar20 * 8 + lVar1 + 2) = (short)uVar20;
          uVar20 = uVar20 + 1;
        } while (uVar2 != uVar20);
      }
      uVar15 = (ulong)((int)uVar15 + puVar5[lVar16]);
      lVar16 = lVar16 + 1;
    } while (lVar16 != lVar21 + (ulong)(lVar21 == 0));
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&__return_storage_ptr__->table,__return_storage_ptr__->frame_size * 0xc);
    __return_storage_ptr__->table_type = LARGE;
    puVar5 = (__return_storage_ptr__->nfreqs).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar6 = (__return_storage_ptr__->table).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar16 = 0;
    iVar17 = 0;
    do {
      uVar2 = puVar5[lVar16];
      if ((ulong)uVar2 != 0) {
        uVar15 = 0;
        do {
          uVar20 = (ulong)(uint)(iVar17 + (int)uVar15);
          *(uint *)(puVar6 + uVar20 * 0xc) = uVar2;
          *(int *)(puVar6 + uVar20 * 0xc + 8) = (int)lVar16;
          *(int *)(puVar6 + uVar20 * 0xc + 4) = (int)uVar15;
          uVar15 = uVar15 + 1;
        } while (uVar2 != uVar15);
        iVar17 = iVar17 + puVar5[lVar16];
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 != lVar21 + (ulong)(lVar21 == 0));
  }
  __return_storage_ptr__->lower_bound = __return_storage_ptr__->frame_size << 4;
  return __return_storage_ptr__;
}

Assistant:

static ans_int_decode load(const uint8_t* in_u8)
    {
        ans_int_decode model;
        model.nfreqs = ans_load_interp(in_u8);
        auto max_norm_freq
            = *std::max_element(model.nfreqs.begin(), model.nfreqs.end());
        model.frame_size = std::accumulate(
            std::begin(model.nfreqs), std::end(model.nfreqs), 0);
        model.frame_mask = model.frame_size - 1;
        model.frame_log2 = log2(model.frame_size);
        auto max_sym = model.nfreqs.size() - 1;
        uint64_t tmp = constants::K * constants::RADIX;
        uint32_t cur_base = 0;
        if (max_norm_freq <= std::numeric_limits<uint16_t>::max()) {
            model.table.resize(model.frame_size * sizeof(dec_entry_int_small));
            model.table_type = dec_table_type::SMALL;
            auto table
                = reinterpret_cast<dec_entry_int_small*>(model.table.data());
            for (size_t sym = 0; sym <= max_sym; sym++) {
                auto cur_freq = model.nfreqs[sym];
                for (uint32_t k = 0; k < cur_freq; k++) {
                    dec_entry_int_small* entry = table + cur_base + k;
                    entry->freq = cur_freq;
                    entry->sym = sym;
                    entry->offset = k;
                }
                cur_base += model.nfreqs[sym];
            }
        } else {
            model.table.resize(model.frame_size * sizeof(dec_entry_int));
            model.table_type = dec_table_type::LARGE;
            auto table = reinterpret_cast<dec_entry_int*>(model.table.data());
            for (size_t sym = 0; sym <= max_sym; sym++) {
                auto cur_freq = model.nfreqs[sym];
                if (cur_freq == 0)
                    continue;
                for (uint32_t k = 0; k < cur_freq; k++) {
                    dec_entry_int* entry = table + cur_base + k;
                    table[cur_base + k].freq = cur_freq;
                    table[cur_base + k].sym = sym;
                    table[cur_base + k].offset = k;
                }
                dec_entry_int* entry = table + cur_base;
                cur_base += model.nfreqs[sym];
            }
        }
        model.lower_bound = constants::K * model.frame_size;
        return model;
    }